

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *e,rt_expression_interface<double> *repl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  undefined4 extraout_var_00;
  element_type *peVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  rt_expression_interface<double> *repl_local;
  rt_expression_interface<double> *e_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  uVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                    (this,e);
  if ((uVar1 & 1) == 0) {
    this_local = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
    peVar5 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
    iVar2 = (*peVar5->_vptr_rt_expression_interface[0xe])(peVar5,e,repl);
    peVar6 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>
             ::operator->(&this->op_);
    iVar3 = (*peVar6->_vptr_op_interface[2])();
    peVar5 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->rhs_);
    iVar4 = (*peVar5->_vptr_rt_expression_interface[0xe])(peVar5,e,repl);
    rt_binary_expr(this_local,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2),
                   (op_interface_type *)CONCAT44(extraout_var_01,iVar3),
                   (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar4));
  }
  else {
    iVar2 = (*repl->_vptr_rt_expression_interface[2])();
    this_local = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                 CONCAT44(extraout_var,iVar2);
  }
  return &this_local->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * substitute(const InterfaceType * e,
                                 const InterfaceType * repl) const
      {
        if (deep_equal(e))
          return repl->clone();

        return new rt_binary_expr(lhs_->substitute(e, repl),
                               op_->clone(),
                               rhs_->substitute(e, repl) );
      }